

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eci.cc
# Opt level: O3

CoordGeodetic * __thiscall Eci::ToGeodetic(CoordGeodetic *__return_storage_ptr__,Eci *this)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_30;
  
  dVar6 = (this->m_position).x;
  dVar8 = (this->m_position).y;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_30 = atan(dVar8 / dVar6);
    if (dVar6 <= 0.0) {
      local_30 = local_30 + 3.141592653589793;
    }
  }
  else {
    local_30 = *(double *)(&DAT_00116090 + (ulong)(0.0 < dVar8) * 8);
  }
  dVar3 = DateTime::ToGreenwichSiderealTime(&this->m_dt);
  dVar6 = (this->m_position).x;
  dVar8 = (this->m_position).y;
  dVar8 = SQRT(dVar6 * dVar6 + dVar8 * dVar8);
  dVar6 = (this->m_position).z;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    dVar6 = atan(dVar6 / dVar8);
    if (dVar8 <= 0.0) {
      dVar6 = dVar6 + 3.141592653589793;
    }
  }
  else {
    dVar6 = *(double *)(&DAT_00116090 + (ulong)(0.0 < dVar6) * 8);
  }
  uVar1 = 0;
  do {
    dVar4 = sin(dVar6);
    dVar5 = dVar4 * -0.006694317778266723 * dVar4 + 1.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar4 = (1.0 / dVar5) * 6378.135 * 0.006694317778266723 * dVar4 + (this->m_position).z;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      dVar4 = atan(dVar4 / dVar8);
      if (dVar8 <= 0.0) {
        dVar4 = dVar4 + 3.141592653589793;
      }
    }
    else {
      dVar4 = *(double *)(&DAT_00116090 + (ulong)(0.0 < dVar4) * 8);
    }
  } while ((1e-10 <= ABS(dVar4 - dVar6)) &&
          (bVar2 = uVar1 < 9, dVar6 = dVar4, uVar1 = uVar1 + 1, bVar2));
  dVar6 = (local_30 - dVar3) + 3.141592653589793;
  dVar3 = floor(dVar6 / 6.283185307179586);
  dVar7 = cos(dVar4);
  __return_storage_ptr__->latitude = dVar4;
  __return_storage_ptr__->longitude = dVar3 * -6.283185307179586 + dVar6 + -3.141592653589793;
  __return_storage_ptr__->altitude = (1.0 / dVar5) * -6378.135 + dVar8 / dVar7;
  return __return_storage_ptr__;
}

Assistant:

CoordGeodetic Eci::ToGeodetic() const
{
    const double theta = Util::AcTan(m_position.y, m_position.x);

    const double lon = Util::WrapNegPosPI(theta
            - m_dt.ToGreenwichSiderealTime());

    const double r = sqrt((m_position.x * m_position.x)
            + (m_position.y * m_position.y));
    
    static const double e2 = kF * (2.0 - kF);

    double lat = Util::AcTan(m_position.z, r);
    double phi = 0.0;
    double c = 0.0;
    int cnt = 0;

    do
    {
        phi = lat;
        const double sinphi = sin(phi);
        c = 1.0 / sqrt(1.0 - e2 * sinphi * sinphi);
        lat = Util::AcTan(m_position.z + kXKMPER * c * e2 * sinphi, r);
        cnt++;
    }
    while (fabs(lat - phi) >= 1e-10 && cnt < 10);

    const double alt = r / cos(lat) - kXKMPER * c;

    return CoordGeodetic(lat, lon, alt, true);
}